

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::ClockingEventExpression>
          (ConstraintExprVisitor *this,ClockingEventExpression *expr)

{
  int iVar1;
  Expression *this_00;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar2;
  size_type sVar3;
  long lVar4;
  Type *pTVar5;
  bool bVar6;
  RandMode RVar7;
  ExpressionKind EVar8;
  SubroutineKind SVar9;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar10;
  Diagnostic *diag;
  SourceLocation SVar11;
  long lVar13;
  DiagCode code;
  ASTContext *this_01;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint local_28;
  byte local_23;
  SourceLocation SVar12;
  
  if (this->failed != false) goto LAB_00258b74;
  if (((this->isSoft == true) &&
      (symbol = Expression::getSymbolReference(&expr->super_Expression,true),
      symbol != (Symbol *)0x0)) &&
     (RVar7 = ASTContext::getRandMode(this->context,symbol), RVar7 == RandC)) {
    ASTContext::addDiag(this->context,(DiagCode)0x340008,(expr->super_Expression).sourceRange);
  }
  EVar8 = (expr->super_Expression).kind;
  if ((Call < EVar8) || ((0x340000U >> (EVar8 & OpenRange) & 1) == 0)) {
    TimingControl::visit<slang::ast::ConstraintExprVisitor>(expr->timingControl,this);
    EVar8 = (expr->super_Expression).kind;
  }
  bVar6 = true;
  if (0x14 < (int)EVar8) {
    switch(EVar8) {
    case OpenRange:
      goto switchD_00258a5d_caseD_1f;
    case Dist:
      local_30 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_28 = local_28 & 0xffffff00;
      this_00 = (Expression *)expr->timingControl;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (this_00,this_00,(DistVarVisitor *)&local_30);
      if ((char)local_28 != '\0') {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x370008,this_00->sourceRange);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_00258a5d_caseD_21;
    case NewCovergroup:
      break;
    default:
      if (EVar8 == Call) {
        SVar9 = CallExpression::getSubroutineKind((CallExpression *)expr);
        if (SVar9 == Task) {
          this_01 = this->context;
          SVar12 = (expr->super_Expression).sourceRange.startLoc;
          SVar11 = (expr->super_Expression).sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x44;
          goto LAB_00258b6b;
        }
        if (*(char *)&expr[1].super_Expression.sourceRange.endLoc != '\x01') {
          ppSVar10 = std::
                     get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                               ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                 *)&expr->timingControl);
          pSVar2 = *ppSVar10;
          if ((pSVar2->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pSVar2->super_Scope);
          }
          sVar3 = (pSVar2->arguments).size_;
          if (sVar3 != 0) {
            lVar13 = 0;
            do {
              lVar4 = *(long *)((long)(pSVar2->arguments).data_ + lVar13);
              iVar1 = *(int *)(lVar4 + 0x90);
              if (iVar1 == 3) {
                if ((*(byte *)(lVar4 + 0x8c) & 1) == 0) goto LAB_00258c2d;
              }
              else if (iVar1 == 1) {
LAB_00258c2d:
                this_01 = this->context;
                SVar12 = (expr->super_Expression).sourceRange.startLoc;
                SVar11 = (expr->super_Expression).sourceRange.endLoc;
                code.subsystem = Statements;
                code.code = 0x2d;
                goto LAB_00258b6b;
              }
              lVar13 = lVar13 + 8;
            } while (sVar3 << 3 != lVar13);
          }
        }
      }
    }
    goto switchD_00258a30_caseD_5;
  }
  switch(EVar8) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_30,(SVIntStorage *)(expr + 1));
    goto LAB_00258b06;
  case RealLiteral:
  case TimeLiteral:
    this_01 = this->context;
    SVar12 = (expr->super_Expression).sourceRange.startLoc;
    SVar11 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2a;
    break;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_30);
LAB_00258b06:
    if ((0x40 < local_28 || (local_23 & 1) != 0) && ((void *)local_30.val != (void *)0x0)) {
      operator_delete__(local_30.pVal);
    }
    if ((local_23 & 1) == 0) {
      return true;
    }
    this_01 = this->context;
    SVar12 = (expr->super_Expression).sourceRange.startLoc;
    SVar11 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x49;
    break;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case NamedValue:
  case HierarchicalValue:
  case UnaryOp:
    goto switchD_00258a30_caseD_5;
  case BinaryOp:
    if ((0x12 < *(uint *)&expr->timingControl) ||
       ((0x61800U >> (*(uint *)&expr->timingControl & 0x1f) & 1) == 0))
    goto switchD_00258a30_caseD_5;
switchD_00258a5d_caseD_21:
    this_01 = this->context;
    SVar12 = (expr->super_Expression).sourceRange.startLoc;
    SVar11 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x13;
    break;
  default:
    if (EVar8 == Streaming) goto switchD_00258a5d_caseD_21;
switchD_00258a30_caseD_5:
    pTVar5 = (expr->super_Expression).type.ptr;
    if (pTVar5 == (Type *)0x0) {
LAB_00258c42:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                );
    }
    bVar6 = Type::isValidForRand(pTVar5,Rand);
    if (bVar6) {
      return true;
    }
    diag = ASTContext::addDiag(this->context,(DiagCode)0x290008,(expr->super_Expression).sourceRange
                              );
    pTVar5 = (expr->super_Expression).type.ptr;
    if (pTVar5 == (Type *)0x0) goto LAB_00258c42;
    ast::operator<<(diag,pTVar5);
    goto LAB_00258b70;
  }
LAB_00258b6b:
  sourceRange.endLoc = SVar11;
  sourceRange.startLoc = SVar12;
  ASTContext::addDiag(this_01,code,sourceRange);
LAB_00258b70:
  this->failed = true;
LAB_00258b74:
  bVar6 = false;
switchD_00258a5d_caseD_1f:
  return bVar6;
}

Assistant:

bool visit(const T& expr) {
        if (failed)
            return false;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (isSoft) {
                if (auto sym = expr.getSymbolReference()) {
                    RandMode mode = context.getRandMode(*sym);
                    if (mode == RandMode::RandC)
                        context.addDiag(diag::RandCInSoft, expr.sourceRange);
                }
            }

            if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {
                    expr.visitExprs(*this);
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    switch (expr.template as<BinaryExpression>().op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return visitInvalid(expr);
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::OpenRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return visitInvalid(expr);
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return visitInvalid(expr);
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!expr.type->isValidForRand(RandMode::Rand)) {
                context.addDiag(diag::NonIntegralConstraintExpr, expr.sourceRange) << *expr.type;
                return visitInvalid(expr);
            }
        }

        return true;
    }